

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# future.hpp
# Opt level: O3

void __thiscall mxx::requests::~requests(requests *this)

{
  ~requests(this);
  operator_delete(this,0x20);
  return;
}

Assistant:

virtual ~requests() {
        this->waitall();
    }